

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall embree::ISPCGridMesh::commit(ISPCGridMesh *this)

{
  RTCGeometry pRVar1;
  ISPCGeometry *in_RDI;
  uint t;
  RTCGeometry g;
  ISPCType local_14;
  
  pRVar1 = in_RDI->geometry;
  rtcSetGeometryTimeStepCount(pRVar1,in_RDI[2].type);
  rtcSetGeometryTimeRange(in_RDI[1].materialID,*(undefined4 *)&in_RDI[1].visited,pRVar1);
  for (local_14 = TRIANGLE_MESH; local_14 < in_RDI[2].type; local_14 = local_14 + SUBDIV_MESH) {
    rtcSetSharedGeometryBuffer
              (pRVar1,1,local_14,0x9003,*(undefined8 *)(*(long *)(in_RDI + 1) + (ulong)local_14 * 8)
               ,0,0x10,*(undefined4 *)&in_RDI[2].field_0x4);
  }
  rtcSetSharedGeometryBuffer
            (pRVar1,8,0,0xa001,in_RDI[1].geometry,0,0xc,*(undefined4 *)&in_RDI[2].geometry);
  rtcSetGeometryUserData(pRVar1,in_RDI);
  if (assignShadersFunc != (AssignShaderTy)0x0) {
    (*assignShadersFunc)(in_RDI);
  }
  rtcCommitGeometry(pRVar1);
  return;
}

Assistant:

void ISPCGridMesh::commit()
  {
    RTCGeometry g = geom.geometry;
    rtcSetGeometryTimeStepCount(g,numTimeSteps);
    rtcSetGeometryTimeRange(g,startTime,endTime);
    
    for (unsigned int t=0; t<numTimeSteps; t++) {
      rtcSetSharedGeometryBuffer(g, RTC_BUFFER_TYPE_VERTEX, t, RTC_FORMAT_FLOAT3, positions[t], 0, sizeof(Vec3fa), numVertices);
    }    
    rtcSetSharedGeometryBuffer(g, RTC_BUFFER_TYPE_GRID, 0, RTC_FORMAT_GRID, grids, 0, sizeof(ISPCGrid), numGrids);
    rtcSetGeometryUserData(g, this);
       
    if (assignShadersFunc) assignShadersFunc(&geom);
    rtcCommitGeometry(g);
  }